

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sndseq.cpp
# Opt level: O3

int FindMode(int seqnum,int mode)

{
  FSoundSequence *pFVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  
  if (0 < seqnum) {
    pFVar1 = Sequences.super_TArray<FSoundSequence_*,_FSoundSequence_*>.Array[(uint)seqnum];
    if (((char)pFVar1->Script[0] == '\x10') && (uVar3 = pFVar1->Script[0] >> 8, 0 < (int)uVar3)) {
      uVar4 = 0;
      do {
        if (pFVar1[1].Script[uVar4 * 2 + -3] == mode) {
          if ((long)(int)Sequences.super_TArray<FSoundSequence_*,_FSoundSequence_*>.Count < 1) {
            return -1;
          }
          uVar2 = (long)(int)Sequences.super_TArray<FSoundSequence_*,_FSoundSequence_*>.Count;
          while ((Sequences.super_TArray<FSoundSequence_*,_FSoundSequence_*>.Array[uVar2 - 1] ==
                  (FSoundSequence *)0x0 ||
                 ((Sequences.super_TArray<FSoundSequence_*,_FSoundSequence_*>.Array[uVar2 - 1]->
                  SeqName).Index != pFVar1[1].Script[uVar4 * 2 + -2]))) {
            bVar5 = uVar2 < 2;
            uVar2 = uVar2 - 1;
            if (bVar5) {
              return -1;
            }
          }
          return (int)uVar2 + -1;
        }
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
  }
  return seqnum;
}

Assistant:

static int FindMode(int seqnum, int mode)
{
	if (seqnum <= 0)
	{ // Sequence does not exist.
		return seqnum;
	}
	FSoundSequence *seq = Sequences[seqnum];
	if (GetCommand(seq->Script[0]) != SS_CMD_SELECT)
	{ // This sequence doesn't select any others.
		return seqnum;
	}
	// Search for the desired mode amongst the selections
	int nummodes = GetData(seq->Script[0]);
	for (int i = 0; i < nummodes; ++i)
	{
		if (seq->Script[1 + i*2] == mode)
		{
			return FindSequence(ENamedName(seq->Script[1 + i*2 + 1]));
		}
	}
	// The mode isn't selected, which means it stays on this sequence.
	return seqnum;
}